

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestTable.cpp
# Opt level: O2

void __thiscall UnitTest_table5::Run(UnitTest_table5 *this)

{
  bool bVar1;
  size_t sVar2;
  Value VVar3;
  allocator local_89;
  string local_88;
  anon_union_8_9_8deb4486_for_Value_0 local_68;
  ValueT local_60;
  Value key;
  Table t;
  
  luna::Table::Table(&t);
  key.field_0.obj_ = (GCObject *)0x0;
  key.type_ = ValueT_Nil;
  local_68.obj_ = (GCObject *)0x0;
  local_60 = 2;
  for (sVar2 = 1; sVar2 != 5; sVar2 = sVar2 + 1) {
    local_68.num_ = (double)(int)sVar2;
    luna::Table::InsertArrayValue(&t,sVar2,(Value *)&local_68);
  }
  bVar1 = luna::Table::EraseArrayValue(&t,1);
  if (!bVar1) {
    std::__cxx11::string::string((string *)&local_88,"\'t.EraseArrayValue(1)\'",&local_89);
    UnitTestBase::Error(&this->super_UnitTestBase,&local_88);
    std::__cxx11::string::~string((string *)&local_88);
  }
  bVar1 = luna::Table::EraseArrayValue(&t,1);
  if (!bVar1) {
    std::__cxx11::string::string((string *)&local_88,"\'t.EraseArrayValue(1)\'",&local_89);
    UnitTestBase::Error(&this->super_UnitTestBase,&local_88);
    std::__cxx11::string::~string((string *)&local_88);
  }
  sVar2 = luna::Table::ArraySize(&t);
  if (sVar2 != 2) {
    std::__cxx11::string::string((string *)&local_88,"\'t.ArraySize() == 2\'",&local_89);
    UnitTestBase::Error(&this->super_UnitTestBase,&local_88);
    std::__cxx11::string::~string((string *)&local_88);
  }
  key.type_ = ValueT_Number;
  key.field_0.num_ = 1.0;
  VVar3 = luna::Table::GetValue(&t,&key);
  local_68 = VVar3.field_0;
  local_60 = VVar3.type_;
  if (local_60 != ValueT_Number) {
    std::__cxx11::string::string
              ((string *)&local_88,"\'value.type_ == luna::ValueT_Number\'",&local_89);
    UnitTestBase::Error(&this->super_UnitTestBase,&local_88);
    std::__cxx11::string::~string((string *)&local_88);
  }
  if ((local_68.num_ != 3.0) || (NAN(local_68.num_))) {
    std::__cxx11::string::string((string *)&local_88,"\'value.num_ == 3\'",&local_89);
    UnitTestBase::Error(&this->super_UnitTestBase,&local_88);
    std::__cxx11::string::~string((string *)&local_88);
  }
  key.field_0.num_ = 2.0;
  VVar3 = luna::Table::GetValue(&t,&key);
  local_68 = VVar3.field_0;
  local_60 = VVar3.type_;
  if (local_60 != ValueT_Number) {
    std::__cxx11::string::string
              ((string *)&local_88,"\'value.type_ == luna::ValueT_Number\'",&local_89);
    UnitTestBase::Error(&this->super_UnitTestBase,&local_88);
    std::__cxx11::string::~string((string *)&local_88);
  }
  if ((local_68.num_ != 4.0) || (NAN(local_68.num_))) {
    std::__cxx11::string::string((string *)&local_88,"\'value.num_ == 4\'",&local_89);
    UnitTestBase::Error(&this->super_UnitTestBase,&local_88);
    std::__cxx11::string::~string((string *)&local_88);
  }
  luna::Table::~Table(&t);
  return;
}

Assistant:

TEST_CASE(table5)
{
    luna::Table t;
    luna::Value key;
    luna::Value value;

    value.type_ = luna::ValueT_Number;

    for (int i = 0; i < 4; ++i)
    {
        value.num_ = i + 1;
        t.InsertArrayValue(i + 1, value);
    }

    EXPECT_TRUE(t.EraseArrayValue(1));
    EXPECT_TRUE(t.EraseArrayValue(1));

    EXPECT_TRUE(t.ArraySize() == 2);

    key.type_ = luna::ValueT_Number;

    key.num_ = 1;
    value = t.GetValue(key);
    EXPECT_TRUE(value.type_ == luna::ValueT_Number);
    EXPECT_TRUE(value.num_ == 3);

    key.num_ = 2;
    value = t.GetValue(key);
    EXPECT_TRUE(value.type_ == luna::ValueT_Number);
    EXPECT_TRUE(value.num_ == 4);
}